

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  uVar8 = 0;
  bVar16 = flag != 0;
  uVar13 = 0xbfd25e8cd0364142;
  if (!bVar16) {
    uVar13 = uVar8;
  }
  uVar1 = r->d[3];
  uVar10 = 0xbaaedce6af48a03b;
  if (!bVar16) {
    uVar10 = uVar8;
  }
  uVar15 = 0xfffffffffffffffe;
  if (!bVar16) {
    uVar15 = uVar8;
  }
  uVar14 = -(ulong)bVar16;
  uVar12 = r->d[0] ^ uVar14;
  uVar9 = r->d[1] ^ uVar14;
  uVar11 = r->d[2] ^ uVar14;
  uVar2 = (ulong)CARRY8(uVar12,uVar13);
  uVar3 = uVar9 + uVar10;
  uVar10 = (ulong)(CARRY8(uVar9,uVar10) || CARRY8(uVar3,uVar2));
  uVar9 = uVar11 + uVar15;
  bVar6 = r->d[1] == 0;
  bVar7 = r->d[0] == 0;
  bVar5 = r->d[2] == 0;
  bVar4 = uVar1 == 0;
  uVar13 = uVar12 + uVar13;
  if (((bVar6 && bVar7) && bVar5) && bVar4) {
    uVar13 = uVar8;
  }
  r->d[0] = uVar13;
  uVar12 = uVar9 + uVar10;
  uVar13 = uVar3 + uVar2;
  if (((bVar6 && bVar7) && bVar5) && bVar4) {
    uVar12 = uVar8;
    uVar13 = uVar8;
  }
  r->d[1] = uVar13;
  r->d[2] = uVar12;
  uVar13 = ((uVar14 ^ uVar1) - (ulong)bVar16) +
           (ulong)(CARRY8(uVar11,uVar15) || CARRY8(uVar9,uVar10));
  if (((bVar6 && bVar7) && bVar5) && bVar4) {
    uVar13 = uVar8;
  }
  r->d[3] = uVar13;
  return -(uint)bVar16 | 1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    uint64_t mask = !flag - 1;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    uint128_t t = (uint128_t)(r->d[0] ^ mask) + ((SECP256K1_N_0 + 1) & mask);
    r->d[0] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[1] ^ mask) + (SECP256K1_N_1 & mask);
    r->d[1] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[2] ^ mask) + (SECP256K1_N_2 & mask);
    r->d[2] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[3] ^ mask) + (SECP256K1_N_3 & mask);
    r->d[3] = t & nonzero;
    return 2 * (mask == 0) - 1;
}